

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

bool __thiscall helics::Input::checkUpdate(Input *this,bool assumeUpdate)

{
  bool bVar1;
  byte in_SIL;
  ValueFederate *in_RDI;
  anon_class_16_2_e880800d visitor;
  data_view dv;
  Input *in_stack_000002e0;
  Input *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  
  if ((in_RDI->field_0x58 & 1) == 0) {
    bVar1 = true;
    if (((in_RDI->field_0x59 & 1) == 0) && (bVar1 = true, (in_SIL & 1) == 0)) {
      bVar1 = helics::ValueFederate::isUpdated
                        ((ValueFederate *)CONCAT17(1,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
    }
    in_RDI->field_0x59 = bVar1;
  }
  else if (((in_SIL & 1) != 0) ||
          (bVar1 = helics::ValueFederate::isUpdated
                             ((ValueFederate *)
                              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98), bVar1)) {
    helics::ValueFederate::getBytes
              (in_RDI,(Input *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if (*(int *)&in_RDI->field_0x54 == -1) {
      loadSourceInformation(in_stack_000002e0);
    }
    std::
    visit<helics::Input::checkUpdate(bool)::__0&,std::variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>&>
              ((anon_class_16_2_e880800d *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)in_stack_ffffffffffffff98);
    data_view::~data_view((data_view *)0x432425);
  }
  return (bool)(in_RDI->field_0x59 & 1);
}

Assistant:

bool Input::checkUpdate(bool assumeUpdate)
{
    if (changeDetectionEnabled) {
        if (assumeUpdate || fed->isUpdated(*this)) {
            auto dv = fed->getBytes(*this);
            if (injectionType == DataType::HELICS_UNKNOWN) {
                loadSourceInformation();
            }
            auto visitor = [&, this](auto&& arg) {
                std::remove_reference_t<decltype(arg)> newVal;
                (void)arg;  // suppress VS2015 warning
                if (injectionType == helics::DataType::HELICS_DOUBLE) {
                    defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
                    valueExtract(val, newVal);
                } else if (injectionType == helics::DataType::HELICS_INT) {
                    defV val;
                    integerExtractAndConvert(val, dv, inputUnits, outputUnits);
                    valueExtract(val, newVal);
                } else {
                    valueExtract(dv, injectionType, newVal);
                }

                if (changeDetected(lastValue, newVal, delta)) {
                    lastValue = newVal;
                    hasUpdate = true;
                }
            };
            std::visit(visitor, lastValue);
        }
    } else {
        hasUpdate = (hasUpdate || assumeUpdate || fed->isUpdated(*this));
    }
    return hasUpdate;
}